

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O3

void __thiscall dlib::timer<dlib::text_field>::stop(timer<dlib::text_field> *this)

{
  pthread_mutex_lock((pthread_mutex_t *)
                     &((this->gc).
                       super___shared_ptr<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m);
  (this->super_timer_base).running = false;
  timer_global_clock::remove
            ((this->gc).super___shared_ptr<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(char *)this);
  pthread_mutex_unlock
            ((pthread_mutex_t *)
             &((this->gc).super___shared_ptr<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->m);
  return;
}

Assistant:

void timer<T>::
    stop (
    )
    {
        gc->m.lock();
        running = false;
        gc->remove(this);
        gc->m.unlock();
    }